

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GravityCompensationHelpers.cpp
# Opt level: O3

bool __thiscall
iDynTree::GravityCompensationHelper::updateKinematicsFromGravity
          (GravityCompensationHelper *this,JointPosDoubleArray *jointPos,FrameIndex *floatingFrame,
          Vector3 *gravity)

{
  bool bVar1;
  Vector3 properClassicalAcceleration;
  Vector3 local_18;
  
  if (this->m_isModelValid == false) {
    iDynTree::reportError
              ("GravityCompensationHelper","updateKinematicsFromGravity",
               "Model and sensors information is not set");
    bVar1 = false;
  }
  else {
    local_18.m_data[0]._0_4_ = *(undefined4 *)gravity->m_data;
    local_18.m_data[1]._0_4_ = *(undefined4 *)(gravity->m_data + 1);
    local_18.m_data[0]._4_4_ = *(uint *)((long)gravity->m_data + 4) ^ 0x80000000;
    local_18.m_data[1]._4_4_ = *(uint *)((long)gravity->m_data + 0xc) ^ 0x80000000;
    local_18.m_data[2] = -gravity->m_data[2];
    bVar1 = updateKinematicsFromProperAcceleration(this,jointPos,floatingFrame,&local_18);
  }
  return bVar1;
}

Assistant:

bool GravityCompensationHelper::updateKinematicsFromGravity(const JointPosDoubleArray& jointPos, const FrameIndex& floatingFrame, const Vector3& gravity)
  {
    if (!m_isModelValid)
    {
      iDynTree::reportError("GravityCompensationHelper", "updateKinematicsFromGravity", "Model and sensors information is not set");
      return false;
    }
    
    iDynTree::Vector3 properClassicalAcceleration;
    properClassicalAcceleration(0) = -gravity(0);
    properClassicalAcceleration(1) = -gravity(1);
    properClassicalAcceleration(2) = -gravity(2);
    
    return updateKinematicsFromProperAcceleration(jointPos, floatingFrame, properClassicalAcceleration);
  }